

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

DescriptorFlags __thiscall
Js::PathTypeHandlerWithAttr::GetSetter
          (PathTypeHandlerWithAttr *this,DynamicObject *instance,PropertyId propertyId,
          Var *setterValue,PropertyValueInfo *info,ScriptContext *requestContext)

{
  ObjectSlotAttributes attr_00;
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  PropertyAttributes attributes;
  uint16 uVar4;
  PropertyIndex PVar5;
  DescriptorFlags DVar6;
  TypePath *this_00;
  ObjectSlotAttributes **ppOVar7;
  uchar **ppuVar8;
  undefined4 *puVar9;
  Var pvVar10;
  PathTypeSetterSlotIndex setterSlot;
  ObjectSlotAttributes attr;
  PropertyIndex propertyIndex;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *setterValue_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  PathTypeHandlerWithAttr *this_local;
  
  this_00 = PathTypeHandlerBase::GetTypePath((PathTypeHandlerBase *)this);
  uVar4 = PathTypeHandlerBase::GetPathLength((PathTypeHandlerBase *)this);
  PVar5 = TypePath::LookupInline(this_00,propertyId,(uint)uVar4);
  if (PVar5 == 0xffff) {
    DVar6 = DynamicTypeHandler::GetSetter
                      ((DynamicTypeHandler *)this,instance,propertyId,setterValue,info,
                       requestContext);
    return DVar6;
  }
  ppOVar7 = Memory::WriteBarrierPtr::operator_cast_to_ObjectSlotAttributes__
                      ((WriteBarrierPtr *)&this->attributes);
  attr_00 = (*ppOVar7)[PVar5];
  if ((attr_00 & ObjectSlotAttr_Deleted) == ObjectSlotAttr_None) {
    if ((attr_00 & ObjectSlotAttr_Accessor) == ObjectSlotAttr_None) {
      if ((attr_00 & ObjectSlotAttr_Writable) != ObjectSlotAttr_None) {
        return WritableData;
      }
      return Data;
    }
    ppuVar8 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                        ((WriteBarrierPtr *)&this->setters);
    if (*ppuVar8 == (uchar *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xe98,"(setters != nullptr)","setters != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    ppuVar8 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                        ((WriteBarrierPtr *)&this->setters);
    bVar1 = (*ppuVar8)[PVar5];
    if ((bVar1 == 0xff) ||
       (uVar4 = PathTypeHandlerBase::GetPathLength((PathTypeHandlerBase *)this), uVar4 <= bVar1)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xe9a,
                                  "(setterSlot != NoSetterSlot && setterSlot < GetPathLength())",
                                  "setterSlot != NoSetterSlot && setterSlot < GetPathLength()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    bVar3 = VarIsCorrectType<Js::DynamicObject>(instance);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xe9b,"(VarIsCorrectType(instance))","VarIsCorrectType(instance)"
                                 );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    pvVar10 = DynamicObject::GetSlot(instance,(uint)bVar1);
    *setterValue = pvVar10;
    attributes = PathTypeHandlerBase::ObjectSlotAttributesToPropertyAttributes(attr_00);
    PropertyValueInfo::Set
              (info,&instance->super_RecyclableObject,(ushort)bVar1,attributes,InlineCacheSetterFlag
              );
    return Accessor;
  }
  return None;
}

Assistant:

DescriptorFlags PathTypeHandlerWithAttr::GetSetter(DynamicObject* instance, PropertyId propertyId, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        PropertyIndex propertyIndex = GetTypePath()->LookupInline(propertyId, GetPathLength());
        if (propertyIndex == Constants::NoSlot)
        {
            return __super::GetSetter(instance, propertyId, setterValue, info, requestContext);
        }
        ObjectSlotAttributes attr = attributes[propertyIndex];
        if (attr & ObjectSlotAttr_Deleted)
        {
            return None;
        }

        if (attr & ObjectSlotAttr_Accessor)
        {
            Assert(setters != nullptr);
            PathTypeSetterSlotIndex setterSlot = setters[propertyIndex];
            Assert(setterSlot != NoSetterSlot && setterSlot < GetPathLength());
            AssertOrFailFast(VarIsCorrectType(instance));
            *setterValue = instance->GetSlot(setterSlot);
            PropertyValueInfo::Set(info, instance, setterSlot, ObjectSlotAttributesToPropertyAttributes(attr), InlineCacheSetterFlag);
            return Accessor;
        }

        if (attr & ObjectSlotAttr_Writable)
        {
            return WritableData;
        }
        return Data;
    }